

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledRgbaOutputFile::setFrameBuffer
          (TiledRgbaOutputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  size_t in_RCX;
  size_t in_RDX;
  Rgba *in_RSI;
  long in_RDI;
  FrameBuffer fb;
  size_t ys;
  size_t xs;
  Lock lock;
  FrameBuffer *in_stack_000003c8;
  TiledOutputFile *in_stack_000003d0;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  Lock *in_stack_fffffffffffffe90;
  Slice local_160;
  Slice local_128;
  Slice local_f0;
  Slice local_a8;
  size_t local_40;
  size_t local_38;
  size_t local_20;
  size_t local_18;
  Rgba *local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_38 = in_RDX << 3;
    local_40 = in_RCX << 3;
    FrameBuffer::FrameBuffer((FrameBuffer *)0x1ae103);
    Slice::Slice(&local_a8,HALF,(char *)local_10,local_38,local_40,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                        (char *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                        (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
    Slice::Slice(&local_f0,HALF,(char *)&local_10->g,local_38,local_40,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                        (char *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                        (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
    Slice::Slice(&local_128,HALF,(char *)&local_10->b,local_38,local_40,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                        (char *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                        (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
    Slice::Slice(&local_160,HALF,(char *)&local_10->a,local_38,local_40,1,1,0.0,false,false);
    FrameBuffer::insert((FrameBuffer *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                        (char *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                        (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
    TiledOutputFile::setFrameBuffer(in_stack_000003d0,in_stack_000003c8);
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x1ae2c8);
  }
  else {
    local_20 = in_RCX;
    local_18 = in_RDX;
    IlmThread_2_5::Lock::Lock
              (in_stack_fffffffffffffe90,
               (Mutex *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0));
    ToYa::setFrameBuffer(*(ToYa **)(in_RDI + 0x10),local_10,local_18,local_20);
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  return;
}

Assistant:

void
TiledRgbaOutputFile::setFrameBuffer (const Rgba *base,
				     size_t xStride,
				     size_t yStride)
{
    if (_toYa)
    {
	Lock lock (*_toYa);
	_toYa->setFrameBuffer (base, xStride, yStride);
    }
    else
    {
	size_t xs = xStride * sizeof (Rgba);
	size_t ys = yStride * sizeof (Rgba);

	FrameBuffer fb;

	fb.insert ("R", Slice (HALF, (char *) &base[0].r, xs, ys));
	fb.insert ("G", Slice (HALF, (char *) &base[0].g, xs, ys));
	fb.insert ("B", Slice (HALF, (char *) &base[0].b, xs, ys));
	fb.insert ("A", Slice (HALF, (char *) &base[0].a, xs, ys));

	_outputFile->setFrameBuffer (fb);
    }
}